

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void exprCodeBetween(Parse *pParse,Expr *pExpr,int dest,_func_void_Parse_ptr_Expr_ptr_int_int *xJump
                    ,int jumpIfNull)

{
  byte bVar1;
  sqlite3 *db;
  int iReg;
  Expr *p;
  long in_FS_OFFSET;
  int regFree1;
  int local_12c;
  Expr local_128;
  Expr local_d8;
  Expr local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_12c = 0;
  db = pParse->db;
  p = (Expr *)0x0;
  local_d8.y.pTab = (Table *)0x0;
  local_d8.iColumn = 0;
  local_d8.iAgg = 0;
  local_d8.w = (anon_union_4_2_009eaf8f_for_w)0x0;
  local_d8.pAggInfo = (AggInfo *)0x0;
  local_d8.x.pList = (ExprList *)0x0;
  local_d8.nHeight = 0;
  local_d8.iTable = 0;
  local_d8.pLeft = (Expr *)0x0;
  local_d8.pRight = (Expr *)0x0;
  local_d8.op = '\0';
  local_d8.affExpr = '\0';
  local_d8.op2 = '\0';
  local_d8._3_1_ = 0;
  local_d8.flags = 0;
  local_d8.u.zToken = (char *)0x0;
  local_128.op = '\0';
  local_128.affExpr = '\0';
  local_128.op2 = '\0';
  local_128._3_1_ = 0;
  local_128.flags = 0;
  local_128.u.zToken = (char *)0x0;
  local_128.pLeft = (Expr *)0x0;
  local_128.pRight = (Expr *)0x0;
  local_128.x.pList = (ExprList *)0x0;
  local_128.nHeight = 0;
  local_128.iTable = 0;
  local_128.iColumn = 0;
  local_128.iAgg = 0;
  local_128.w = (anon_union_4_2_009eaf8f_for_w)0x0;
  local_128.pAggInfo = (AggInfo *)0x0;
  local_128.y.pTab = (Table *)0x0;
  local_88.op = '\0';
  local_88.affExpr = '\0';
  local_88.op2 = '\0';
  local_88._3_1_ = 0;
  local_88.flags = 0;
  local_88.u.zToken = (char *)0x0;
  local_88.pLeft = (Expr *)0x0;
  local_88.pRight = (Expr *)0x0;
  local_88.x.pList = (ExprList *)0x0;
  local_88.nHeight = 0;
  local_88.iTable = 0;
  local_88.iColumn = 0;
  local_88.iAgg = 0;
  local_88.w = (anon_union_4_2_009eaf8f_for_w)0x0;
  local_88.pAggInfo = (AggInfo *)0x0;
  local_88.y.pTab = (Table *)0x0;
  if (pExpr->pLeft != (Expr *)0x0) {
    p = exprDup(db,pExpr->pLeft,0,(EdupBuf *)0x0);
  }
  if (db->mallocFailed == '\0') {
    local_88.op = ',';
    local_88.pLeft = &local_d8;
    local_88.pRight = &local_128;
    local_d8.op = ':';
    local_d8.pRight = *(Expr **)&((pExpr->x).pSelect)->iLimit;
    local_128.op = '8';
    local_128.pRight = (Expr *)((pExpr->x).pSelect)->pEList;
    local_128.pLeft = p;
    local_d8.pLeft = p;
    iReg = exprCodeVector(pParse,p,&local_12c);
    sqlite3ExprToRegister(p,iReg);
    if (xJump == (_func_void_Parse_ptr_Expr_ptr_int_int *)0x0) {
      *(byte *)&p->flags = (byte)p->flags | 1;
      sqlite3ExprCodeTarget(pParse,&local_88,dest);
    }
    else {
      (*xJump)(pParse,&local_88,dest,jumpIfNull);
    }
    if (local_12c != 0) {
      bVar1 = pParse->nTempReg;
      if ((ulong)bVar1 < 8) {
        pParse->nTempReg = bVar1 + 1;
        pParse->aTempReg[bVar1] = local_12c;
      }
    }
  }
  if (p != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,p);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void exprCodeBetween(
  Parse *pParse,    /* Parsing and code generating context */
  Expr *pExpr,      /* The BETWEEN expression */
  int dest,         /* Jump destination or storage location */
  void (*xJump)(Parse*,Expr*,int,int), /* Action to take */
  int jumpIfNull    /* Take the jump if the BETWEEN is NULL */
){
  Expr exprAnd;     /* The AND operator in  x>=y AND x<=z  */
  Expr compLeft;    /* The  x>=y  term */
  Expr compRight;   /* The  x<=z  term */
  int regFree1 = 0; /* Temporary use register */
  Expr *pDel = 0;
  sqlite3 *db = pParse->db;

  memset(&compLeft, 0, sizeof(Expr));
  memset(&compRight, 0, sizeof(Expr));
  memset(&exprAnd, 0, sizeof(Expr));

  assert( ExprUseXList(pExpr) );
  pDel = sqlite3ExprDup(db, pExpr->pLeft, 0);
  if( db->mallocFailed==0 ){
    exprAnd.op = TK_AND;
    exprAnd.pLeft = &compLeft;
    exprAnd.pRight = &compRight;
    compLeft.op = TK_GE;
    compLeft.pLeft = pDel;
    compLeft.pRight = pExpr->x.pList->a[0].pExpr;
    compRight.op = TK_LE;
    compRight.pLeft = pDel;
    compRight.pRight = pExpr->x.pList->a[1].pExpr;
    sqlite3ExprToRegister(pDel, exprCodeVector(pParse, pDel, &regFree1));
    if( xJump ){
      xJump(pParse, &exprAnd, dest, jumpIfNull);
    }else{
      /* Mark the expression is being from the ON or USING clause of a join
      ** so that the sqlite3ExprCodeTarget() routine will not attempt to move
      ** it into the Parse.pConstExpr list.  We should use a new bit for this,
      ** for clarity, but we are out of bits in the Expr.flags field so we
      ** have to reuse the EP_OuterON bit.  Bummer. */
      pDel->flags |= EP_OuterON;
      sqlite3ExprCodeTarget(pParse, &exprAnd, dest);
    }
    sqlite3ReleaseTempReg(pParse, regFree1);
  }
  sqlite3ExprDelete(db, pDel);

  /* Ensure adequate test coverage */
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull==0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull==0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull!=0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfTrue  && jumpIfNull!=0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull==0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull==0 && regFree1!=0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull!=0 && regFree1==0 );
  testcase( xJump==sqlite3ExprIfFalse && jumpIfNull!=0 && regFree1!=0 );
  testcase( xJump==0 );
}